

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Chapters::Atom::Parse(Atom *this,IMkvReader *pReader,longlong pos,longlong size)

{
  longlong lVar1;
  longlong val_2;
  longlong val_1;
  longlong val;
  long status;
  longlong size_1;
  longlong id;
  longlong stop;
  longlong size_local;
  longlong pos_local;
  IMkvReader *pReader_local;
  Atom *this_local;
  
  id = pos + size;
  stop = size;
  size_local = pos;
  pos_local = (longlong)pReader;
  pReader_local = (IMkvReader *)this;
  do {
    do {
      if (id <= size_local) {
        if (size_local != id) {
          return -2;
        }
        return 0;
      }
      val = ParseElementHeader((IMkvReader *)pos_local,&size_local,id,&size_1,&status);
      if (val < 0) {
        return val;
      }
    } while (status == 0);
    if (size_1 == 0x80) {
      val = ParseDisplay(this,(IMkvReader *)pos_local,size_local,status);
joined_r0x001274e8:
      if (val < 0) {
        return val;
      }
    }
    else {
      if (size_1 == 0x5654) {
        val = UnserializeString((IMkvReader *)pos_local,size_local,status,&this->m_string_uid);
        goto joined_r0x001274e8;
      }
      if (size_1 == 0x73c4) {
        val = UnserializeInt((IMkvReader *)pos_local,size_local,status,&val_1);
        if (val < 0) {
          return val;
        }
        this->m_uid = val_1;
      }
      else if (size_1 == 0x91) {
        lVar1 = UnserializeUInt((IMkvReader *)pos_local,size_local,status);
        if (lVar1 < 0) {
          return lVar1;
        }
        this->m_start_timecode = lVar1;
      }
      else if (size_1 == 0x92) {
        lVar1 = UnserializeUInt((IMkvReader *)pos_local,size_local,status);
        if (lVar1 < 0) {
          return lVar1;
        }
        this->m_stop_timecode = lVar1;
      }
    }
    size_local = status + size_local;
    if (id < size_local) {
      return -2;
    }
  } while( true );
}

Assistant:

long Chapters::Atom::Parse(IMkvReader* pReader, long long pos, long long size) {
  const long long stop = pos + size;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // 0 length payload, skip.
      continue;

    if (id == libwebm::kMkvChapterDisplay) {
      status = ParseDisplay(pReader, pos, size);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterStringUID) {
      status = UnserializeString(pReader, pos, size, m_string_uid);

      if (status < 0)  // error
        return status;
    } else if (id == libwebm::kMkvChapterUID) {
      long long val;
      status = UnserializeInt(pReader, pos, size, val);

      if (status < 0)  // error
        return status;

      m_uid = static_cast<unsigned long long>(val);
    } else if (id == libwebm::kMkvChapterTimeStart) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_start_timecode = val;
    } else if (id == libwebm::kMkvChapterTimeEnd) {
      const long long val = UnserializeUInt(pReader, pos, size);

      if (val < 0)  // error
        return static_cast<long>(val);

      m_stop_timecode = val;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}